

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::BiasParameter::SerializeWithCachedSizes(BiasParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  void *pvVar2;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(1,this->axis_,output);
  }
  if ((uVar1 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(2,this->num_axes_,output);
  }
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (3,(MessageLite *)this->filler_,output);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void BiasParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.BiasParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 axis = 1 [default = 1];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->axis(), output);
  }

  // optional int32 num_axes = 2 [default = 1];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->num_axes(), output);
  }

  // optional .caffe.FillerParameter filler = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, *this->filler_, output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.BiasParameter)
}